

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  bool bVar1;
  MySQLConnector *this;
  QueryMode *this_00;
  
  initscr();
  start_color();
  noecho();
  cbreak();
  this = (MySQLConnector *)operator_new(8);
  MySQLConnector::MySQLConnector(this);
  this_00 = (QueryMode *)operator_new(0x20);
  QueryMode::QueryMode(this_00,this);
  do {
    bVar1 = QueryMode::update(this_00);
  } while (!bVar1);
  QueryMode::~QueryMode(this_00);
  operator_delete(this_00,0x20);
  MySQLConnector::~MySQLConnector(this);
  operator_delete(this,8);
  endwin();
  return 0;
}

Assistant:

int main()
{
	initscr();
	start_color();
	noecho();
	cbreak();

	MySQLConnector *connector = new MySQLConnector();
	

	QueryMode *queryMode = new QueryMode(connector);

	bool done = false;
	while(!done)
	{
		done = queryMode->update();
	}

	delete queryMode;
	queryMode = NULL;


	delete connector;
	connector = NULL;


/*	WINDOW *win = newwin(4, COLS, LINES - 4, 0);
	init_pair(1, COLOR_BLACK, COLOR_GREEN);
	wbkgd(win, COLOR_PAIR(1));
	wrefresh(win); */

	endwin();

	return 0;
}